

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddFullItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  undefined8 __args;
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  long lVar4;
  char *__s;
  byte local_108;
  allocator<char> local_f1;
  string local_f0;
  FeatureDescriptor *local_d0;
  void *local_c8;
  ItemIsPath local_c0;
  byte local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string name;
  undefined1 local_70 [8];
  string file;
  string local_40 [8];
  string generator;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  generator.field_2._8_8_ = entry;
  bVar1 = CheckImplicitDirItem(this,entry);
  if (bVar1) {
    return;
  }
  if (((this->NoSONameUsesPath & 1U) != 0) && (bVar1 = CheckSharedLibNoSOName(this,entry), bVar1)) {
    return;
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_40);
  PVar3 = cmGeneratorTarget::GetPolicyStatusCMP0008(this->Target);
  if ((PVar3 != NEW) &&
     ((lVar4 = std::__cxx11::string::find((char *)local_40,0xc18879), lVar4 != -1 ||
      (lVar4 = std::__cxx11::string::find((char *)local_40,0xc1987f), lVar4 != -1)))) {
    cmsys::SystemTools::GetFilenameName((string *)local_70,(string *)generator.field_2._8_8_);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(string *)local_70);
    if (!bVar1) {
      HandleBadFullItem(this,entry,(string *)local_70);
    }
    name.field_2._13_3_ = 0;
    name.field_2._M_local_buf[0xc] = !bVar1;
    std::__cxx11::string::~string((string *)local_70);
    if (name.field_2._12_4_ != 0) goto LAB_005ee405;
  }
  if ((this->LinkTypeEnabled & 1U) != 0) {
    cmsys::SystemTools::GetFilenameName((string *)local_98,(string *)generator.field_2._8_8_);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)local_98);
    if (bVar1) {
      SetCurrentLinkType(this,LinkShared);
    }
    else {
      bVar1 = cmsys::RegularExpression::find
                        (&this->ExtractStaticLibraryName,(string *)generator.field_2._8_8_);
      if (!bVar1) {
        SetCurrentLinkType(this,this->StartLinkType);
      }
    }
    std::__cxx11::string::~string((string *)local_98);
  }
  local_b9 = 0;
  local_108 = 0;
  if ((this->OldLinkDirMode & 1U) != 0) {
    cmsys::SystemTools::GetFilenamePath(&local_b8,(string *)generator.field_2._8_8_);
    local_b9 = 1;
    bVar1 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&this->OldLinkDirMask,&local_b8);
    local_108 = bVar1 ^ 0xff;
  }
  if ((local_b9 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_108 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldLinkDirItems,(value_type *)generator.field_2._8_8_);
  }
  __args = generator.field_2._8_8_;
  local_c0 = Yes;
  local_c8 = (void *)0x0;
  _Var2 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
  bVar1 = false;
  if (_Var2) {
    __s = "__CMAKE_LINK_LIBRARY";
    if (entry->Kind == Object) {
      __s = "__CMAKE_LINK_OBJECT";
    }
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,__s,&local_f1);
  }
  else {
    std::__cxx11::string::string((string *)&local_f0,(string *)&entry->Feature);
  }
  local_d0 = FindLibraryFeature(this,&local_f0);
  std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
  emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
            ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
              *)this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)__args,&local_c0,&local_c8,&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_f1);
  }
  name.field_2._12_4_ = 0;
LAB_005ee405:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmComputeLinkInformation::AddFullItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // Check for the implicit link directory special case.
  if (this->CheckImplicitDirItem(entry)) {
    return;
  }

  // Check for case of shared library with no builtin soname.
  if (this->NoSONameUsesPath && this->CheckSharedLibNoSOName(entry)) {
    return;
  }

  // Full path libraries should specify a valid library file name.
  // See documentation of CMP0008.
  std::string generator = this->GlobalGenerator->GetName();
  if (this->Target->GetPolicyStatusCMP0008() != cmPolicies::NEW &&
      (generator.find("Visual Studio") != std::string::npos ||
       generator.find("Xcode") != std::string::npos)) {
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractAnyLibraryName.find(file)) {
      this->HandleBadFullItem(entry, file);
      return;
    }
  }

  // This is called to handle a link item that is a full path.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (this->LinkTypeEnabled) {
    std::string name = cmSystemTools::GetFilenameName(item.Value);
    if (this->ExtractSharedLibraryName.find(name)) {
      this->SetCurrentLinkType(LinkShared);
    } else if (!this->ExtractStaticLibraryName.find(item.Value)) {
      // We cannot determine the type.  Assume it is the target's
      // default type.
      this->SetCurrentLinkType(this->StartLinkType);
    }
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  // Now add the full path to the library.
  this->Items.emplace_back(
    item, ItemIsPath::Yes, nullptr,
    this->FindLibraryFeature(
      entry.Feature == DEFAULT
        ? (entry.Kind == cmComputeLinkDepends::LinkEntry::Object
             ? "__CMAKE_LINK_OBJECT"
             : "__CMAKE_LINK_LIBRARY")
        : entry.Feature));
}